

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_preview.cpp
# Opt level: O0

void __thiscall QPreviewPaintEngine::abort(QPreviewPaintEngine *this)

{
  QPreviewPaintEnginePrivate *c;
  QPreviewPaintEnginePrivate *d;
  
  c = d_func((QPreviewPaintEngine *)0x15515b);
  (**(code **)(*(long *)this + 0x18))();
  qDeleteAll<QList<QPicture_const*>>((QList<const_QPicture_*> *)c);
  c->state = Aborted;
  return;
}

Assistant:

bool QPreviewPaintEngine::abort()
{
    Q_D(QPreviewPaintEngine);
    end();
    qDeleteAll(d->pages);
    d->state = QPrinter::Aborted;

    return true;
}